

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::eliminate_reshape_after_global_pooling(NetOptimize *this)

{
  int iVar1;
  value_type pLVar2;
  value_type pLVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  reference ppLVar7;
  reference pvVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  reference pvVar11;
  long in_RDI;
  int top_blob_index_final;
  Reshape *reshape;
  int j;
  int top_blob_index;
  Pooling *pooling;
  int i;
  int layer_count;
  char *in_stack_ffffffffffffffa8;
  FILE *in_stack_ffffffffffffffb0;
  int local_20;
  int local_10;
  
  sVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40));
  iVar5 = (int)sVar6;
  local_10 = 0;
  do {
    if (iVar5 <= local_10) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
               (long)local_10);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (!bVar4) {
      ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                           (long)local_10);
      pLVar2 = *ppLVar7;
      if (*(int *)((long)&pLVar2[1].type.field_2 + 4) != 0) {
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_10);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->tops,0);
        iVar1 = *pvVar8;
        local_20 = local_10;
        do {
          do {
            do {
              local_20 = local_20 + 1;
              if (iVar5 <= local_20) goto LAB_001190ab;
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                         (long)local_20);
              bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
            } while (bVar4);
            ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                 (in_RDI + 0x40),(long)local_20);
            sVar6 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar7)->bottoms);
          } while (sVar6 != 1);
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_20);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->bottoms,0);
        } while (*pvVar8 != iVar1);
LAB_001190ab:
        if (local_20 != iVar5) {
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_20);
          pLVar3 = *ppLVar7;
          if (((*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == -0xe9) &&
              (iVar1._0_1_ = pLVar3[1].one_blob_only, iVar1._1_1_ = pLVar3[1].support_inplace,
              iVar1._2_1_ = pLVar3[1].support_vulkan, iVar1._3_1_ = pLVar3[1].support_packing,
              iVar1 == -0xe9)) && (pLVar3[1].typeindex == 0)) {
            in_stack_ffffffffffffffb0 = _stderr;
            uVar9 = std::__cxx11::string::c_str();
            uVar10 = std::__cxx11::string::c_str();
            fprintf(in_stack_ffffffffffffffb0,"eliminate_reshape_after_global_pooling %s %s\n",uVar9
                    ,uVar10);
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->tops,0);
            iVar1 = *pvVar8;
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar2->tops,0);
            *pvVar8 = iVar1;
            pvVar11 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),
                                 (long)iVar1);
            pvVar11->producer = local_10;
            std::__cxx11::string::operator=((string *)&pLVar3->type,"ncnnfused");
          }
        }
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_reshape_after_global_pooling()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Pooling")
            continue;

        ncnn::Pooling* pooling = (ncnn::Pooling*)layers[i];
        if (pooling->global_pooling == 0)
            continue;

        // Pooling - Reshape
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "Reshape")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Reshape* reshape = (ncnn::Reshape*)layers[j];
        if (reshape->h != -233 || reshape->c != -233 || reshape->permute != 0)
            continue;

        fprintf(stderr, "eliminate_reshape_after_global_pooling %s %s\n", pooling->name.c_str(), reshape->name.c_str());

        int top_blob_index_final = reshape->tops[0];
        pooling->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        reshape->type = "ncnnfused";
    }

    return 0;
}